

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O3

double __thiscall jrtplib::RTPSourceData::INF_GetEstimatedTimestampUnit(RTPSourceData *this)

{
  RTPNTPTime RVar1;
  RTPNTPTime RVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = -1.0;
  if ((this->SRprevinf).hasinfo == true) {
    RVar1 = (this->SRinf).ntptimestamp;
    uVar3 = RVar1.msw;
    if (uVar3 < 0x83aa7e80) {
      RVar2 = (this->SRprevinf).ntptimestamp;
      dVar5 = 0.0;
      if (RVar2.msw < 0x83aa7e80) {
        return dVar4;
      }
    }
    else {
      RVar2 = (this->SRprevinf).ntptimestamp;
      if (RVar2.msw < 0x83aa7e80) {
        return dVar4;
      }
      dVar5 = (double)((long)((double)((ulong)RVar1 >> 0x20) * 2.3283064365386963e-10 * 1000000.0) &
                      0xffffffff) * 1e-06 + (double)(int)(uVar3 + 0x7c558180);
    }
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar6 = (double)((long)((double)((ulong)RVar2 >> 0x20) * 2.3283064365386963e-10 * 1000000.0) &
                      0xffffffff) * 1e-06 + (double)(int)(RVar2.msw + 0x7c558180);
      if (((dVar6 != 0.0) || (NAN(dVar6))) && (dVar6 < dVar5)) {
        return (dVar5 - dVar6) /
               (double)((this->SRinf).rtptimestamp - (this->SRprevinf).rtptimestamp);
      }
    }
  }
  return dVar4;
}

Assistant:

double RTPSourceData::INF_GetEstimatedTimestampUnit() const
{
	if (!SRprevinf.HasInfo())
		return -1.0;
	
	RTPTime t1 = RTPTime(SRinf.GetNTPTimestamp());
	RTPTime t2 = RTPTime(SRprevinf.GetNTPTimestamp());
	if (t1.IsZero() || t2.IsZero()) // one of the times couldn't be calculated
		return -1.0;

	if (t1 <= t2)
		return -1.0;

	t1 -= t2; // get the time difference
	
	uint32_t tsdiff = SRinf.GetRTPTimestamp()-SRprevinf.GetRTPTimestamp();
	
	return (t1.GetDouble()/((double)tsdiff));
}